

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O3

void Diligent::anon_unknown_61::ValidatePipelineResourceSignatures
               (PipelineStateCreateInfo *CreateInfo,IRenderDevice *pDevice)

{
  Uint32 *Args_6;
  PipelineResourceLayoutDesc *LayoutDesc;
  _Hash_node_base *p_Var1;
  ShaderResourceVariableDesc *Args_6_00;
  Uint32 UVar2;
  undefined4 uVar3;
  SHADER_TYPE SVar4;
  __buckets_ptr pp_Var5;
  _Hash_node_base *p_Var6;
  char *pcVar7;
  __node_base _Var8;
  ShaderResourceVariableDesc *pSVar9;
  __node_type *p_Var10;
  ImmutableSamplerDesc *pIVar11;
  __node_type *p_Var12;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
  *p_Var13;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
  *p_Var14;
  bool bVar15;
  size_type sVar16;
  size_type sVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  undefined4 extraout_var;
  IPipelineResourceSignature **ppIVar22;
  char **ppcVar23;
  char **ppcVar24;
  undefined4 extraout_var_00;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false> _Var25;
  _Hash_node_base *p_Var26;
  __node_base_ptr *__s;
  __node_base_ptr p_Var27;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false> _Var28;
  __node_base_ptr *__s_00;
  __node_base_ptr p_Var29;
  __node_type *p_Var30;
  long lVar31;
  __node_type *p_Var32;
  char (*in_RCX) [19];
  _Hash_node_base *p_Var33;
  __hash_code __code;
  __hash_code __code_00;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE ShaderStages_02;
  size_type sVar34;
  ulong uVar35;
  __node_ptr p_Var36;
  ulong uVar37;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false> _Var38;
  ulong uVar39;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false> _Var40;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false> it;
  __node_base _Var41;
  char *pcVar42;
  Char *pCVar43;
  __node_ptr __n_00;
  _Hash_node_base _Var44;
  _Hash_node_base _Var45;
  __node_type *p_Var46;
  __node_type *p_Var47;
  __node_ptr __n;
  Char **Args_6_01;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>_>
  pVar48;
  undefined1 auVar49 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>_>
  pVar50;
  ShaderResourceVariableDesc SVar51;
  string msg_1;
  uint local_14c;
  char **local_148;
  undefined8 local_140;
  ulong local_138;
  char *local_130;
  undefined4 local_124;
  String local_120;
  unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
  AllResources;
  unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
  AllImtblSamplers;
  array<const_Diligent::IPipelineResourceSignature_*,_8UL> ppSignatures;
  int *piVar21;
  
  pcVar42 = (char *)pDevice;
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)&ppSignatures,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])0x751392,in_RCX);
    pcVar42 = "ValidatePipelineResourceSignatures";
    in_RCX = (char (*) [19])0x0;
    DebugAssertionFailed
              ((Char *)ppSignatures._M_elems[0],"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xd3);
    if (ppSignatures._M_elems[0] != (IPipelineResourceSignature *)(ppSignatures._M_elems + 2)) {
      pcVar42 = (char *)((long)&(ppSignatures._M_elems[2]->super_IDeviceObject).super_IObject.
                                _vptr_IObject + 1);
      operator_delete(ppSignatures._M_elems[0],(ulong)pcVar42);
    }
  }
  iVar19 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  piVar21 = (int *)CONCAT44(extraout_var,iVar19);
  local_124 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if (((byte *)CreateInfo->pInternalData != (byte *)0x0) && ((*CreateInfo->pInternalData & 1) != 0))
  {
    if (CreateInfo->ResourceSignaturesCount == 1) {
      local_124 = 0;
    }
    else {
      ppSignatures._M_elems[0] =
           (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
      pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
      AllResources._M_h._M_buckets = (__buckets_ptr)0x6cf608;
      if (pp_Var5 != (__buckets_ptr)0x0) {
        AllResources._M_h._M_buckets = pp_Var5;
      }
      pcVar42 = "ValidatePipelineResourceSignatures";
      local_124 = 0;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[89],unsigned_int,char[13]>
                (false,"ValidatePipelineResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0xdd,(char (*) [16])"Description of ",(char **)&ppSignatures,
                 (char (*) [7])0x6a829c,(char **)&AllResources,(char (*) [15])"\' is invalid: ",
                 (char (*) [89])
                 "When PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0 flag is set, ResourceSignaturesCount ("
                 ,&CreateInfo->ResourceSignaturesCount,(char (*) [13])") must be 1.");
    }
  }
  Args_6 = &CreateInfo->ResourceSignaturesCount;
  UVar2 = CreateInfo->ResourceSignaturesCount;
  ppIVar22 = CreateInfo->ppResourceSignatures;
  pcVar42 = (char *)CONCAT71((int7)((ulong)pcVar42 >> 8),
                             ppIVar22 == (IPipelineResourceSignature **)0x0 && UVar2 != 0);
  if (ppIVar22 == (IPipelineResourceSignature **)0x0 && UVar2 != 0) {
    ppSignatures._M_elems[0] =
         (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
    pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
    AllResources._M_h._M_buckets = (__buckets_ptr)0x6cf608;
    if (pp_Var5 != (__buckets_ptr)0x0) {
      AllResources._M_h._M_buckets = pp_Var5;
    }
    pcVar42 = "ValidatePipelineResourceSignatures";
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[60],unsigned_int,char[15]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xe0,(char (*) [16])"Description of ",(char **)&ppSignatures,(char (*) [7])0x6a829c,
               (char **)&AllResources,(char (*) [15])"\' is invalid: ",
               (char (*) [60])"ppResourceSignatures is null, but ResourceSignaturesCount (",Args_6,
               (char (*) [15])") is not zero.");
    ppIVar22 = CreateInfo->ppResourceSignatures;
    UVar2 = CreateInfo->ResourceSignaturesCount;
  }
  if ((ppIVar22 != (IPipelineResourceSignature **)0x0) && (UVar2 == 0)) {
    ppSignatures._M_elems[0] =
         (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
    pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
    AllResources._M_h._M_buckets = (__buckets_ptr)0x6cf608;
    if (pp_Var5 != (__buckets_ptr)0x0) {
      AllResources._M_h._M_buckets = pp_Var5;
    }
    pcVar42 = "ValidatePipelineResourceSignatures";
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[71]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xe3,(char (*) [16])"Description of ",(char **)&ppSignatures,(char (*) [7])0x6a829c,
               (char **)&AllResources,(char (*) [15])"\' is invalid: ",
               (char (*) [71])
               "ppResourceSignatures is not null, but ResourceSignaturesCount is zero.");
    ppIVar22 = CreateInfo->ppResourceSignatures;
  }
  if (ppIVar22 != (IPipelineResourceSignature **)0x0) {
    if ((CreateInfo->PSODesc).SRBAllocationGranularity != 1) {
      pcVar42 = 
      "PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning."
      ;
      FormatString<char[135]>
                ((string *)&ppSignatures,
                 (char (*) [135])
                 "PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        pcVar42 = (char *)ppSignatures._M_elems[0];
        (*(code *)DebugMessageCallback)(1,ppSignatures._M_elems[0],0,0);
      }
      if (ppSignatures._M_elems[0] != (IPipelineResourceSignature *)(ppSignatures._M_elems + 2)) {
        pcVar42 = (char *)((long)&(ppSignatures._M_elems[2]->super_IDeviceObject).super_IObject.
                                  _vptr_IObject + 1);
        operator_delete(ppSignatures._M_elems[0],(ulong)pcVar42);
      }
    }
    if ((char)local_124 != '\0') {
      if ((CreateInfo->PSODesc).ResourceLayout.NumVariables != 0) {
        ppSignatures._M_elems[0] =
             (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType)
        ;
        pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        AllResources._M_h._M_buckets = (__buckets_ptr)0x6cf608;
        if (pp_Var5 != (__buckets_ptr)0x0) {
          AllResources._M_h._M_buckets = pp_Var5;
        }
        pcVar42 = "ValidatePipelineResourceSignatures";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[58],unsigned_int,char[50]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xf2,(char (*) [16])"Description of ",(char **)&ppSignatures,
                   (char (*) [7])0x6a829c,(char **)&AllResources,(char (*) [15])"\' is invalid: ",
                   (char (*) [58])"The number of variables defined through resource layout (",
                   &(CreateInfo->PSODesc).ResourceLayout.NumVariables,
                   (char (*) [50])") must be zero when resource signatures are used.");
      }
      if ((CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers != 0) {
        ppSignatures._M_elems[0] =
             (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType)
        ;
        pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        AllResources._M_h._M_buckets = (__buckets_ptr)0x6cf608;
        if (pp_Var5 != (__buckets_ptr)0x0) {
          AllResources._M_h._M_buckets = pp_Var5;
        }
        pcVar42 = "ValidatePipelineResourceSignatures";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[67],unsigned_int,char[50]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xf8,(char (*) [16])"Description of ",(char **)&ppSignatures,
                   (char (*) [7])0x6a829c,(char **)&AllResources,(char (*) [15])"\' is invalid: ",
                   (char (*) [67])
                   "The number of immutable samplers defined through resource layout (",
                   &(CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers,
                   (char (*) [50])") must be zero when resource signatures are used.");
      }
    }
    AllResources._M_h._M_buckets = &AllResources._M_h._M_single_bucket;
    AllResources._M_h._M_bucket_count = 1;
    AllResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllResources._M_h._M_element_count = 0;
    AllResources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    AllResources._M_h._M_rehash_policy._M_next_resize = 0;
    AllResources._M_h._M_single_bucket = (__node_base_ptr)0x0;
    AllImtblSamplers._M_h._M_buckets = &AllImtblSamplers._M_h._M_single_bucket;
    AllImtblSamplers._M_h._M_bucket_count = 1;
    AllImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllImtblSamplers._M_h._M_element_count = 0;
    AllImtblSamplers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    AllImtblSamplers._M_h._M_rehash_policy._M_next_resize = 0;
    AllImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ppSignatures._M_elems[6] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[7] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[4] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[5] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[2] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[3] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[0] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[1] = (IPipelineResourceSignature *)0x0;
    local_140 = (char *)((ulong)local_140._4_4_ << 0x20);
    if (*Args_6 != 0) {
      uVar20 = 0;
      do {
        p_Var33 = (_Hash_node_base *)CreateInfo->ppResourceSignatures;
        p_Var6 = p_Var33[uVar20]._M_nxt;
        if (p_Var6 == (_Hash_node_base *)0x0) {
          msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (local_120._M_dataplus._M_p == (char *)0x0) {
            local_120._M_dataplus._M_p = "";
          }
          pcVar42 = "ValidatePipelineResourceSignatures";
          p_Var33 = (_Hash_node_base *)0x111;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[38],unsigned_int,char[9]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x111,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6a829c,
                     (char **)&local_120,(char (*) [15])"\' is invalid: ",
                     (char (*) [38])"Pipeline resource signature at index ",(uint *)&local_140,
                     (char (*) [9])0x6d0389);
        }
        ppcVar23 = (char **)(*(code *)p_Var6->_M_nxt[4]._M_nxt)(p_Var6);
        bVar18 = *(byte *)((long)ppcVar23 + 0x24);
        if (7 < bVar18) {
          FormatString<char[127]>
                    (&msg_1,(char (*) [127])
                            "Resource signature binding index exceeds the limit. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc."
                    );
          pcVar42 = "ValidatePipelineResourceSignatures";
          p_Var33 = (_Hash_node_base *)0x115;
          DebugAssertionFailed
                    (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x115);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
            pcVar42 = (char *)(msg_1.field_2._M_allocated_capacity + 1);
            operator_delete(msg_1._M_dataplus._M_p,(ulong)pcVar42);
          }
          bVar18 = *(byte *)((long)ppcVar23 + 0x24);
        }
        uVar35 = (ulong)bVar18;
        if (ppSignatures._M_elems[uVar35] != (IPipelineResourceSignature *)0x0) {
          msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (local_120._M_dataplus._M_p == (char *)0x0) {
            local_120._M_dataplus._M_p = "";
          }
          ppcVar24 = (char **)(*(code *)p_Var6->_M_nxt[4]._M_nxt)(p_Var6);
          local_130 = (char *)CONCAT44(local_130._4_4_,(uint)*(byte *)((long)ppcVar23 + 0x24));
          iVar19 = (*(ppSignatures._M_elems[*(byte *)((long)ppcVar23 + 0x24)]->super_IDeviceObject).
                     super_IObject._vptr_IObject[4])();
          pcVar42 = "ValidatePipelineResourceSignatures";
          p_Var33 = (_Hash_node_base *)0x11b;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[30],char_const*,char[20],unsigned_int,char[45],char_const*,char[28]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x11b,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6a829c,
                     (char **)&local_120,(char (*) [15])"\' is invalid: ",
                     (char (*) [30])"Pipeline resource signature \'",ppcVar24,
                     (char (*) [20])"\' at binding index ",(uint *)&local_130,
                     (char (*) [45])" conflicts with another resource signature \'",
                     (char **)CONCAT44(extraout_var_00,iVar19),
                     (char (*) [28])"\' that uses the same index.");
          uVar35 = (ulong)*(byte *)((long)ppcVar23 + 0x24);
        }
        ppSignatures._M_elems[uVar35] = (IPipelineResourceSignature *)p_Var6;
        local_148 = ppcVar23;
        if (*(int *)(ppcVar23 + 2) != 0) {
          uVar35 = 0;
          do {
            pcVar42 = local_148[1];
            pcVar7 = *(char **)(pcVar42 + uVar35 * 0x18);
            if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
              FormatString<char[108]>
                        (&msg_1,(char (*) [108])
                                "Resource name can\'t be null or empty. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              p_Var33 = (_Hash_node_base *)0x122;
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x122);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
              }
            }
            p_Var1 = (_Hash_node_base *)(pcVar42 + uVar35 * 0x18);
            if (*(int *)&p_Var1[1]._M_nxt == 0) {
              FormatString<char[102]>
                        (&msg_1,(char (*) [102])
                                "Shader stages can\'t be UNKNOWN. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              p_Var33 = (_Hash_node_base *)0x123;
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x123);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
              }
            }
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)&msg_1,(Char *)p_Var1->_M_nxt,false);
            local_138 = uVar35;
            pVar48 = std::
                     unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                     ::equal_range(&AllResources,(key_type *)&msg_1);
            _Var25._M_cur =
                 (__node_type *)
                 pVar48.first.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                 ._M_cur;
            if ((msg_1._M_dataplus._M_p != (pointer)0x0) && ((long)msg_1._M_string_length < 0)) {
              operator_delete__(msg_1._M_dataplus._M_p);
            }
            for (; (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                    )_Var25._M_cur !=
                   pVar48.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                ; _Var25._M_cur = (__node_type *)((_Var25._M_cur)->super__Hash_node_base)._M_nxt) {
              if ((*(uint *)((long)&((_Var25._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                    ._M_storage._M_storage + 0x10) & *(uint *)&p_Var1[1]._M_nxt) !=
                  0) {
                if (*(_Hash_node_base **)
                     ((long)&((_Var25._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                             ._M_storage._M_storage + 0x18) == p_Var6) {
                  FormatString<char[104]>
                            (&msg_1,(char (*) [104])
                                    "Overlapping resources in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                            );
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,299);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                ppcVar23 = (char **)(**(code **)(**(long **)((long)&((_Var25._M_cur)->
                                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
                p_Var33 = (_Hash_node_base *)0x12f;
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[18],char_const*,char[50],char_const*,char[8],char_const*,char[124]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x12f,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x6a829c,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",(char (*) [18])"Shader resource \'",
                           (char **)p_Var1,
                           (char (*) [50])"\' is found in more than one resource signature (\'",
                           local_148,(char (*) [8])"\' and \'",ppcVar23,
                           (char (*) [124])
                           "\') in the same shader stage. Every shader resource in the PSO must be unambiguously defined by only one resource signature."
                          );
              }
              if ((char)piVar21[3] == '\0') {
                if (*(int *)((long)&((_Var25._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                    ._M_storage._M_storage + 0x10) == 0) {
                  FormatString<char[26],char[39]>
                            (&msg_1,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])"OtherRes.Stages != SHADER_TYPE_UNKNOWN",
                             (char (*) [39])p_Var33);
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x134);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                if (*(_Hash_node_base **)
                     ((long)&((_Var25._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                             ._M_storage._M_storage + 0x18) == p_Var6) {
                  FormatString<char[111]>
                            (&msg_1,(char (*) [111])
                                    "Resources with the same name in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                            );
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x135);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                ppcVar23 = (char **)(**(code **)(**(long **)((long)&((_Var25._M_cur)->
                                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
                p_Var33 = (_Hash_node_base *)0x13a;
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[71],char_const*,char[50],char_const*,char[8],char_const*,char[206]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x13a,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x6a829c,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",
                           (char (*) [71])
                           "This device does not support separable programs, but shader resource \'"
                           ,(char **)p_Var1,
                           (char (*) [50])"\' is found in more than one resource signature (\'",
                           local_148,(char (*) [8])"\' and \'",ppcVar23,
                           (char (*) [206])
                           "\') in different stages. When separable programs are not supported, every resource is always shared between all stages. Use distinct resource names for each stage or define a single resource for all stages."
                          );
              }
            }
            uVar3 = *(undefined4 *)&p_Var1[1]._M_nxt;
            p_Var26 = (_Hash_node_base *)operator_new(0x30);
            p_Var26->_M_nxt = (_Hash_node_base *)0x0;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)(p_Var26 + 1),(Char *)p_Var1->_M_nxt,false);
            *(undefined4 *)&p_Var26[3]._M_nxt = uVar3;
            p_Var26[4]._M_nxt = p_Var6;
            p_Var26[5]._M_nxt = p_Var1;
            p_Var33 = p_Var26[2]._M_nxt;
            __code = 1;
            auVar49 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)&AllResources._M_h._M_rehash_policy,
                                 AllResources._M_h._M_bucket_count,
                                 AllResources._M_h._M_element_count);
            sVar34 = auVar49._8_8_;
            __s = AllResources._M_h._M_buckets;
            sVar16 = AllResources._M_h._M_bucket_count;
            if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (sVar34 == 1) {
                AllResources._M_h._M_single_bucket = (__node_base_ptr)0x0;
                __s = &AllResources._M_h._M_single_bucket;
              }
              else {
                __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                ((new_allocator<std::__detail::_Hash_node_base_*> *)&msg_1,sVar34,
                                 (void *)0x0);
                memset(__s,0,sVar34 * 8);
              }
              _Var41._M_nxt = AllResources._M_h._M_before_begin._M_nxt;
              AllResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              if (_Var41._M_nxt != (_Hash_node_base *)0x0) {
                bVar15 = false;
                uVar35 = 0;
                _Var45._M_nxt = (_Hash_node_base *)(__node_base_ptr *)0x0;
                uVar39 = 0;
                do {
                  _Var44._M_nxt = _Var41._M_nxt;
                  _Var41._M_nxt = (_Var44._M_nxt)->_M_nxt;
                  __code = ((ulong)_Var44._M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar34;
                  if ((_Var45._M_nxt == (_Hash_node_base *)0x0) || (uVar39 != __code)) {
                    if (bVar15) {
                      if ((_Var45._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                        bVar15 = false;
                        uVar37 = ((ulong)(_Var45._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) %
                                 sVar34;
                        if (uVar37 == uVar39) goto LAB_004b04e3;
                        __s[uVar37] = _Var45._M_nxt;
                      }
                      bVar15 = false;
                    }
LAB_004b04e3:
                    if (__s[__code] != (_Hash_node_base *)0x0) {
                      (_Var44._M_nxt)->_M_nxt = __s[__code]->_M_nxt;
                      _Var45._M_nxt = __s[__code];
                      goto LAB_004b0524;
                    }
                    (_Var44._M_nxt)->_M_nxt = AllResources._M_h._M_before_begin._M_nxt;
                    __s[__code] = &AllResources._M_h._M_before_begin;
                    uVar39 = __code;
                    AllResources._M_h._M_before_begin._M_nxt = _Var44._M_nxt;
                    if ((_Var44._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                      _Var45._M_nxt = (_Hash_node_base *)(__s + uVar35);
                      uVar35 = __code;
                      goto LAB_004b0524;
                    }
                  }
                  else {
                    (_Var44._M_nxt)->_M_nxt = (_Var45._M_nxt)->_M_nxt;
                    bVar15 = true;
LAB_004b0524:
                    *_Var45._M_nxt = (_Hash_node_base)_Var44._M_nxt;
                    uVar39 = uVar35;
                  }
                  uVar35 = uVar39;
                  _Var45._M_nxt = _Var44._M_nxt;
                  uVar39 = __code;
                } while (_Var41._M_nxt != (_Hash_node_base *)0x0);
                if (((bVar15) && ((_Var44._M_nxt)->_M_nxt != (_Hash_node_base *)0x0)) &&
                   (uVar35 = ((ulong)(_Var44._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) %
                             sVar34, uVar35 != __code)) {
                  __s[uVar35] = _Var44._M_nxt;
                }
              }
              sVar16 = sVar34;
              if (&AllResources._M_h._M_single_bucket != AllResources._M_h._M_buckets) {
                operator_delete(AllResources._M_h._M_buckets,AllResources._M_h._M_bucket_count << 3)
                ;
              }
            }
            AllResources._M_h._M_bucket_count = sVar16;
            AllResources._M_h._M_buckets = __s;
            p_Var36 = (__node_ptr)
                      (((ulong)p_Var33 & 0x7fffffffffffffff) % AllResources._M_h._M_bucket_count);
            pcVar42 = (char *)p_Var36;
            p_Var27 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                      ::_M_find_before_node
                                (&AllResources._M_h,(size_type)p_Var36,
                                 (HashMapStringKey *)(p_Var26 + 1),__code);
            if (p_Var27 == (__node_base_ptr)0x0) {
              p_Var33 = (_Hash_node_base *)AllResources._M_h._M_buckets;
              if (AllResources._M_h._M_buckets[(long)p_Var36] == (__node_base_ptr)0x0) {
                p_Var26->_M_nxt = AllResources._M_h._M_before_begin._M_nxt;
                if (AllResources._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
                  AllResources._M_h._M_buckets
                  [((ulong)AllResources._M_h._M_before_begin._M_nxt[2]._M_nxt & 0x7fffffffffffffff)
                   % AllResources._M_h._M_bucket_count] = p_Var26;
                }
                AllResources._M_h._M_buckets[(long)p_Var36] = &AllResources._M_h._M_before_begin;
                AllResources._M_h._M_before_begin._M_nxt = p_Var26;
              }
              else {
                p_Var26->_M_nxt = AllResources._M_h._M_buckets[(long)p_Var36]->_M_nxt;
                AllResources._M_h._M_buckets[(long)p_Var36]->_M_nxt = p_Var26;
              }
            }
            else {
              p_Var33 = p_Var27->_M_nxt;
              p_Var26->_M_nxt = p_Var33;
              p_Var27->_M_nxt = p_Var26;
            }
            AllResources._M_h._M_element_count = AllResources._M_h._M_element_count + 1;
            uVar35 = local_138 + 1;
          } while (uVar35 < *(uint *)(local_148 + 2));
        }
        if (*(int *)(local_148 + 4) != 0) {
          uVar35 = 0;
          do {
            pcVar42 = local_148[3];
            if ((*(char **)(pcVar42 + uVar35 * 0x48 + 8) == (char *)0x0) ||
               (**(char **)(pcVar42 + uVar35 * 0x48 + 8) == '\0')) {
              FormatString<char[107]>
                        (&msg_1,(char (*) [107])
                                "Sampler name can\'t be null or empty. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              p_Var33 = (_Hash_node_base *)0x143;
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x143);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
              }
            }
            p_Var1 = (_Hash_node_base *)(pcVar42 + uVar35 * 0x48);
            if (*(int *)&p_Var1->_M_nxt == 0) {
              FormatString<char[101]>
                        (&msg_1,(char (*) [101])
                                "Shader stage can\'t be UNKNOWN. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              p_Var33 = (_Hash_node_base *)0x144;
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x144);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
              }
            }
            ppcVar23 = (char **)(pcVar42 + uVar35 * 0x48 + 8);
            HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,*ppcVar23,false);
            local_138 = uVar35;
            pVar50 = std::
                     unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                     ::equal_range(&AllImtblSamplers,(key_type *)&msg_1);
            _Var28._M_cur =
                 (__node_type *)
                 pVar50.first.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                 ._M_cur;
            if ((msg_1._M_dataplus._M_p != (pointer)0x0) && ((long)msg_1._M_string_length < 0)) {
              operator_delete__(msg_1._M_dataplus._M_p);
            }
            for (; (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                    )_Var28._M_cur !=
                   pVar50.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                ; _Var28._M_cur = (__node_type *)((_Var28._M_cur)->super__Hash_node_base)._M_nxt) {
              if ((*(uint *)((long)&((_Var28._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                    ._M_storage._M_storage + 0x10) & *(uint *)&p_Var1->_M_nxt) != 0)
              {
                if (*(_Hash_node_base **)
                     ((long)&((_Var28._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                             ._M_storage._M_storage + 0x18) == p_Var6) {
                  FormatString<char[113]>
                            (&msg_1,(char (*) [113])
                                    "Overlapping immutable samplers in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                            );
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x14c);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                ppcVar24 = (char **)(**(code **)(**(long **)((long)&((_Var28._M_cur)->
                                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
                p_Var33 = (_Hash_node_base *)0x150;
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],char_const*,char[50],char_const*,char[8],char_const*,char[119]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x150,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x6a829c,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",(char (*) [20])"Immutable sampler \'",
                           ppcVar23,(char (*) [50])
                                    "\' is found in more than one resource signature (\'",local_148,
                           (char (*) [8])"\' and \'",ppcVar24,
                           (char (*) [119])
                           "\') in the same stage. Every immutable sampler in the PSO must be unambiguously defined by only one resource signature."
                          );
              }
              if ((char)piVar21[3] == '\0') {
                if (*(int *)((long)&((_Var28._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                    ._M_storage._M_storage + 0x10) == 0) {
                  FormatString<char[26],char[39]>
                            (&msg_1,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])"OtherSam.Stages != SHADER_TYPE_UNKNOWN",
                             (char (*) [39])p_Var33);
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x155);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                if (*(_Hash_node_base **)
                     ((long)&((_Var28._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                             ._M_storage._M_storage + 0x18) == p_Var6) {
                  FormatString<char[120]>
                            (&msg_1,(char (*) [120])
                                    "Immutable samplers with the same name in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                            );
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x156);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                ppcVar24 = (char **)(**(code **)(**(long **)((long)&((_Var28._M_cur)->
                                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
                p_Var33 = (_Hash_node_base *)0x15b;
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[73],char_const*,char[50],char_const*,char[8],char_const*,char[215]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x15b,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x6a829c,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",
                           (char (*) [73])
                           "This device does not support separable programs, but immutable sampler \'"
                           ,ppcVar23,
                           (char (*) [50])"\' is found in more than one resource signature (\'",
                           local_148,(char (*) [8])"\' and \'",ppcVar24,
                           (char (*) [215])
                           "\') in different stages. When separable programs are not supported, every resource is always shared between all stages. Use distinct resource names for each stage or define a single immutable sampler for all stages."
                          );
              }
            }
            uVar3 = *(undefined4 *)&p_Var1->_M_nxt;
            p_Var26 = (_Hash_node_base *)operator_new(0x30);
            p_Var26->_M_nxt = (_Hash_node_base *)0x0;
            HashMapStringKey::HashMapStringKey((HashMapStringKey *)(p_Var26 + 1),*ppcVar23,false);
            *(undefined4 *)&p_Var26[3]._M_nxt = uVar3;
            p_Var26[4]._M_nxt = p_Var6;
            p_Var26[5]._M_nxt = p_Var1;
            p_Var33 = p_Var26[2]._M_nxt;
            __code_00 = 1;
            auVar49 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)&AllImtblSamplers._M_h._M_rehash_policy,
                                 AllImtblSamplers._M_h._M_bucket_count,
                                 AllImtblSamplers._M_h._M_element_count);
            sVar34 = auVar49._8_8_;
            __s_00 = AllImtblSamplers._M_h._M_buckets;
            sVar17 = AllImtblSamplers._M_h._M_bucket_count;
            if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (sVar34 == 1) {
                AllImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
                __s_00 = &AllImtblSamplers._M_h._M_single_bucket;
              }
              else {
                __s_00 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                   ((new_allocator<std::__detail::_Hash_node_base_*> *)&msg_1,sVar34
                                    ,(void *)0x0);
                memset(__s_00,0,sVar34 * 8);
              }
              _Var8._M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
              AllImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              if (_Var8._M_nxt != (_Hash_node_base *)0x0) {
                bVar15 = false;
                uVar35 = 0;
                _Var45._M_nxt = (_Hash_node_base *)(__node_base_ptr *)0x0;
                uVar39 = 0;
                do {
                  _Var44._M_nxt = _Var8._M_nxt;
                  _Var8._M_nxt = (_Var44._M_nxt)->_M_nxt;
                  __code_00 = ((ulong)_Var44._M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar34;
                  if ((_Var45._M_nxt == (_Hash_node_base *)0x0) || (uVar39 != __code_00)) {
                    if (bVar15) {
                      if ((_Var45._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                        bVar15 = false;
                        uVar37 = ((ulong)(_Var45._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) %
                                 sVar34;
                        if (uVar37 == uVar39) goto LAB_004b0b46;
                        __s_00[uVar37] = _Var45._M_nxt;
                      }
                      bVar15 = false;
                    }
LAB_004b0b46:
                    if (__s_00[__code_00] != (_Hash_node_base *)0x0) {
                      (_Var44._M_nxt)->_M_nxt = __s_00[__code_00]->_M_nxt;
                      _Var45._M_nxt = __s_00[__code_00];
                      goto LAB_004b0b87;
                    }
                    (_Var44._M_nxt)->_M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
                    AllImtblSamplers._M_h._M_before_begin._M_nxt = _Var44._M_nxt;
                    __s_00[__code_00] = &AllImtblSamplers._M_h._M_before_begin;
                    uVar39 = __code_00;
                    if ((_Var44._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                      _Var45._M_nxt = (_Hash_node_base *)(__s_00 + uVar35);
                      uVar35 = __code_00;
                      goto LAB_004b0b87;
                    }
                  }
                  else {
                    (_Var44._M_nxt)->_M_nxt = (_Var45._M_nxt)->_M_nxt;
                    bVar15 = true;
LAB_004b0b87:
                    *_Var45._M_nxt = (_Hash_node_base)_Var44._M_nxt;
                    uVar39 = uVar35;
                  }
                  uVar35 = uVar39;
                  _Var45._M_nxt = _Var44._M_nxt;
                  uVar39 = __code_00;
                } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
                if (((bVar15) && ((_Var44._M_nxt)->_M_nxt != (_Hash_node_base *)0x0)) &&
                   (uVar35 = ((ulong)(_Var44._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) %
                             sVar34, uVar35 != __code_00)) {
                  __s_00[uVar35] = _Var44._M_nxt;
                }
              }
              sVar17 = sVar34;
              if (&AllImtblSamplers._M_h._M_single_bucket != AllImtblSamplers._M_h._M_buckets) {
                operator_delete(AllImtblSamplers._M_h._M_buckets,
                                AllImtblSamplers._M_h._M_bucket_count << 3);
              }
            }
            AllImtblSamplers._M_h._M_bucket_count = sVar17;
            AllImtblSamplers._M_h._M_buckets = __s_00;
            p_Var36 = (__node_ptr)
                      (((ulong)p_Var33 & 0x7fffffffffffffff) % AllImtblSamplers._M_h._M_bucket_count
                      );
            pcVar42 = (char *)p_Var36;
            p_Var29 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                      ::_M_find_before_node
                                (&AllImtblSamplers._M_h,(size_type)p_Var36,
                                 (HashMapStringKey *)(p_Var26 + 1),__code_00);
            if (p_Var29 == (__node_base_ptr)0x0) {
              p_Var33 = (_Hash_node_base *)AllImtblSamplers._M_h._M_buckets;
              if (AllImtblSamplers._M_h._M_buckets[(long)p_Var36] == (__node_base_ptr)0x0) {
                p_Var26->_M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
                if (AllImtblSamplers._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
                  AllImtblSamplers._M_h._M_buckets
                  [((ulong)AllImtblSamplers._M_h._M_before_begin._M_nxt[2]._M_nxt &
                   0x7fffffffffffffff) % AllImtblSamplers._M_h._M_bucket_count] = p_Var26;
                }
                AllImtblSamplers._M_h._M_buckets[(long)p_Var36] =
                     &AllImtblSamplers._M_h._M_before_begin;
                AllImtblSamplers._M_h._M_before_begin._M_nxt = p_Var26;
              }
              else {
                p_Var26->_M_nxt = AllImtblSamplers._M_h._M_buckets[(long)p_Var36]->_M_nxt;
                AllImtblSamplers._M_h._M_buckets[(long)p_Var36]->_M_nxt = p_Var26;
              }
            }
            else {
              p_Var33 = p_Var29->_M_nxt;
              p_Var26->_M_nxt = p_Var33;
              p_Var29->_M_nxt = p_Var26;
            }
            AllImtblSamplers._M_h._M_element_count = AllImtblSamplers._M_h._M_element_count + 1;
            uVar35 = local_138 + 1;
          } while (uVar35 < *(uint *)(local_148 + 4));
        }
        uVar20 = (uint)local_140 + 1;
        local_140 = (char *)CONCAT44(local_140._4_4_,uVar20);
      } while (uVar20 < *Args_6);
    }
    _Var8._M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
    if (((char)local_124 == '\0') && (1 < *piVar21 - 3U)) {
      local_14c = 0;
      if ((CreateInfo->PSODesc).ResourceLayout.NumVariables != 0) {
        uVar35 = 0;
        do {
          pSVar9 = (CreateInfo->PSODesc).ResourceLayout.Variables;
          Args_6_00 = pSVar9 + uVar35;
          pCVar43 = pSVar9[uVar35].Name;
          if (pCVar43 == (Char *)0x0) {
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (local_120._M_dataplus._M_p == (char *)0x0) {
              local_120._M_dataplus._M_p = "";
            }
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[15]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x16c,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x6a829c,(char **)&local_120,(char (*) [15])"\' is invalid: ",
                       (char (*) [26])"ResourceLayout.Variables[",&local_14c,
                       (char (*) [15])"].Name is null");
            pCVar43 = Args_6_00->Name;
          }
          HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,pCVar43,false);
          pcVar42 = (char *)&msg_1;
          pVar48 = std::
                   unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                   ::equal_range(&AllResources,(key_type *)&msg_1);
          _Var38 = pVar48.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                   ._M_cur;
          _Var25._M_cur =
               (__node_type *)
               pVar48.first.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
               ._M_cur;
          if ((msg_1._M_dataplus._M_p != (pointer)0x0) && ((long)msg_1._M_string_length < 0)) {
            operator_delete__(msg_1._M_dataplus._M_p);
          }
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
              )_Var25._M_cur !=
              _Var38.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
              ._M_cur) {
            do {
              SVar4 = *(SHADER_TYPE *)
                       ((long)&((_Var25._M_cur)->
                               super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                               ._M_storage._M_storage + 0x10);
              if ((Args_6_00->ShaderStages & SVar4) != SHADER_TYPE_UNKNOWN) {
                if (SVar4 != Args_6_00->ShaderStages) {
                  local_140 = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                  local_130 = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                  if (local_130 == (char *)0x0) {
                    local_130 = "";
                  }
                  GetShaderStagesString_abi_cxx11_
                            (&msg_1,(Diligent *)(ulong)Args_6_00->ShaderStages,ShaderStages);
                  GetShaderStagesString_abi_cxx11_
                            (&local_120,
                             (Diligent *)
                             (ulong)*(uint *)((long)&((_Var25._M_cur)->
                                                                                                          
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x10),ShaderStages_00);
                  pcVar42 = "ValidatePipelineResourceSignatures";
                  LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[28],char_const*,char[35],std::__cxx11::string,char[71],std::__cxx11::string,char[73]>
                            (false,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x17a,(char (*) [16])"Description of ",(char **)&local_140,
                             (char (*) [7])0x6a829c,&local_130,(char (*) [15])"\' is invalid: ",
                             (char (*) [28])"Shader stages of variable \'",&Args_6_00->Name,
                             (char (*) [35])"\' defined by the resource layout (",&msg_1,
                             (char (*) [71])
                             ") do not match the stages defined by the implicit resource signature ("
                             ,&local_120,
                             (char (*) [73])
                             "). This might indicate a bug in the serialization/deserialization logic."
                            );
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_120._M_dataplus._M_p != &local_120.field_2) {
                    pcVar42 = (char *)(local_120.field_2._M_allocated_capacity + 1);
                    operator_delete(local_120._M_dataplus._M_p,(ulong)pcVar42);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    pcVar42 = (char *)(msg_1.field_2._M_allocated_capacity + 1);
                    operator_delete(msg_1._M_dataplus._M_p,(ulong)pcVar42);
                  }
                }
                if (*(SHADER_RESOURCE_VARIABLE_TYPE *)
                     (*(long *)((long)&((_Var25._M_cur)->
                                       super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                       ._M_storage._M_storage + 0x20) + 0x11) != Args_6_00->Type) {
                  msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType)
                  ;
                  local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                  if (local_120._M_dataplus._M_p == (char *)0x0) {
                    local_120._M_dataplus._M_p = "";
                  }
                  local_140 = GetShaderVariableTypeLiteralName(Args_6_00->Type,false);
                  local_130 = GetShaderVariableTypeLiteralName
                                        (*(SHADER_RESOURCE_VARIABLE_TYPE *)
                                          (*(long *)((long)&((_Var25._M_cur)->
                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x20) + 0x11),false);
                  pcVar42 = "ValidatePipelineResourceSignatures";
                  LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[35],char_const*,char[71],char_const*,char[73]>
                            (false,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x181,(char (*) [16])"Description of ",(char **)&msg_1,
                             (char (*) [7])0x6a829c,(char **)&local_120,
                             (char (*) [15])"\' is invalid: ",
                             (char (*) [23])"The type of variable \'",&Args_6_00->Name,
                             (char (*) [35])"\' defined by the resource layout (",
                             (char **)&local_140,
                             (char (*) [71])
                             ") does not match the type defined by the implicit resource signature ("
                             ,&local_130,
                             (char (*) [73])
                             "). This might indicate a bug in the serialization/deserialization logic."
                            );
                }
                break;
              }
              _Var25._M_cur = (__node_type *)((_Var25._M_cur)->super__Hash_node_base)._M_nxt;
            } while ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                      )_Var25._M_cur !=
                     _Var38.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                     ._M_cur);
          }
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
              )_Var25._M_cur !=
              _Var38.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
              ._M_cur) {
            uVar35 = (*(ulong *)((long)&((_Var25._M_cur)->
                                        super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                        ._M_storage._M_storage + 8) & 0x7fffffffffffffff) %
                     AllResources._M_h._M_bucket_count;
            p_Var46 = (__node_type *)AllResources._M_h._M_buckets[uVar35];
            p_Var10 = p_Var46;
            do {
              p_Var30 = p_Var10;
              p_Var10 = (__node_type *)(p_Var30->super__Hash_node_base)._M_nxt;
            } while (p_Var10 != _Var25._M_cur);
            p_Var33 = ((_Var25._M_cur)->super__Hash_node_base)._M_nxt;
            if (p_Var46 == p_Var30) {
              if (p_Var33 != (_Hash_node_base *)0x0) {
                uVar39 = ((ulong)p_Var33[2]._M_nxt & 0x7fffffffffffffff) %
                         AllResources._M_h._M_bucket_count;
                if (uVar39 == uVar35) goto LAB_004b10b2;
                AllResources._M_h._M_buckets[uVar39] = (__node_base_ptr)p_Var46;
                p_Var46 = (__node_type *)AllResources._M_h._M_buckets[uVar35];
              }
              if ((__node_type *)&AllResources._M_h._M_before_begin == p_Var46) {
                AllResources._M_h._M_before_begin._M_nxt = p_Var33;
              }
              AllResources._M_h._M_buckets[uVar35] = (__node_base_ptr)0x0;
            }
            else if ((p_Var33 != (_Hash_node_base *)0x0) &&
                    (uVar39 = ((ulong)p_Var33[2]._M_nxt & 0x7fffffffffffffff) %
                              AllResources._M_h._M_bucket_count, uVar39 != uVar35)) {
              AllResources._M_h._M_buckets[uVar39] = &p_Var30->super__Hash_node_base;
            }
LAB_004b10b2:
            (p_Var30->super__Hash_node_base)._M_nxt =
                 ((_Var25._M_cur)->super__Hash_node_base)._M_nxt;
            pcVar42 = (char *)AllResources._M_h._M_buckets;
            std::__detail::
            _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
            ::_M_deallocate_node
                      ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
                        *)_Var25._M_cur,(__node_ptr)AllResources._M_h._M_buckets);
            AllResources._M_h._M_element_count = AllResources._M_h._M_element_count - 1;
          }
          local_14c = local_14c + 1;
          uVar35 = (ulong)local_14c;
        } while (local_14c < (CreateInfo->PSODesc).ResourceLayout.NumVariables);
      }
      if (AllResources._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        LayoutDesc = &(CreateInfo->PSODesc).ResourceLayout;
        _Var41._M_nxt = AllResources._M_h._M_before_begin._M_nxt;
        do {
          p_Var33 = _Var41._M_nxt[5]._M_nxt;
          if (*(SHADER_RESOURCE_VARIABLE_TYPE *)((long)&p_Var33[2]._M_nxt + 1) !=
              LayoutDesc->DefaultVariableType) {
            if ((*(char *)&p_Var33[2]._M_nxt == '\x06') &&
               (lVar31 = (*(code *)(_Var41._M_nxt[4]._M_nxt)->_M_nxt[4]._M_nxt)(),
               *(char *)(lVar31 + 0x25) == '\x01')) {
              pcVar42 = (char *)p_Var33->_M_nxt;
              SVar51 = FindPipelineResourceLayoutVariable
                                 (LayoutDesc,pcVar42,*(SHADER_TYPE *)&p_Var33[1]._M_nxt,
                                  *(char **)(lVar31 + 0x28));
              if (*(SHADER_RESOURCE_VARIABLE_TYPE *)((long)&p_Var33[2]._M_nxt + 1) == SVar51.Type)
              goto LAB_004b1201;
            }
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (local_120._M_dataplus._M_p == (char *)0x0) {
              local_120._M_dataplus._M_p = "";
            }
            local_140 = GetShaderVariableTypeLiteralName
                                  (*(SHADER_RESOURCE_VARIABLE_TYPE *)((long)&p_Var33[2]._M_nxt + 1),
                                   false);
            local_130 = GetShaderVariableTypeLiteralName(LayoutDesc->DefaultVariableType,false);
            pcVar42 = "ValidatePipelineResourceSignatures";
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[50],char_const*,char[45],char_const*,char[73]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1a4,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x6a829c,(char **)&local_120,(char (*) [15])"\' is invalid: ",
                       (char (*) [23])"The type of variable \'",(char **)p_Var33,
                       (char (*) [50])"\' not explicitly defined by the resource layout (",
                       (char **)&local_140,
                       (char (*) [45])") does not match the default variable type (",&local_130,
                       (char (*) [73])
                       "). This might indicate a bug in the serialization/deserialization logic.");
          }
LAB_004b1201:
          _Var41._M_nxt = (_Var41._M_nxt)->_M_nxt;
        } while (_Var41._M_nxt != (_Hash_node_base *)0x0);
      }
      local_14c = 0;
      if ((CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers != 0) {
        do {
          pIVar11 = (CreateInfo->PSODesc).ResourceLayout.ImmutableSamplers;
          uVar35 = (ulong)local_14c;
          Args_6_01 = &pIVar11[uVar35].SamplerOrTextureName;
          pCVar43 = *Args_6_01;
          if (pCVar43 == (Char *)0x0) {
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (local_120._M_dataplus._M_p == (char *)0x0) {
              local_120._M_dataplus._M_p = "";
            }
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[31]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1ac,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x6a829c,(char **)&local_120,(char (*) [15])"\' is invalid: ",
                       (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_14c,
                       (char (*) [31])"].SamplerOrTextureName is null");
            pCVar43 = *Args_6_01;
          }
          HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,pCVar43,false);
          pVar50 = std::
                   unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                   ::equal_range(&AllImtblSamplers,(key_type *)&msg_1);
          _Var40 = pVar50.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                   ._M_cur;
          _Var28._M_cur =
               (__node_type *)
               pVar50.first.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
               ._M_cur;
          if ((msg_1._M_dataplus._M_p != (pointer)0x0) && ((long)msg_1._M_string_length < 0)) {
            operator_delete__(msg_1._M_dataplus._M_p);
          }
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
              )_Var28._M_cur !=
              _Var40.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
              ._M_cur) {
            pIVar11 = pIVar11 + uVar35;
            do {
              SVar4 = *(SHADER_TYPE *)
                       ((long)&((_Var28._M_cur)->
                               super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                               ._M_storage._M_storage + 0x10);
              if ((pIVar11->ShaderStages & SVar4) != SHADER_TYPE_UNKNOWN) {
                if (SVar4 != pIVar11->ShaderStages) {
                  local_140 = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                  local_130 = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                  if (local_130 == (char *)0x0) {
                    local_130 = "";
                  }
                  GetShaderStagesString_abi_cxx11_
                            (&msg_1,(Diligent *)(ulong)pIVar11->ShaderStages,ShaderStages_01);
                  GetShaderStagesString_abi_cxx11_
                            (&local_120,(Diligent *)(ulong)pIVar11->ShaderStages,ShaderStages_02);
                  LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[37],char_const*,char[35],std::__cxx11::string,char[70],std::__cxx11::string,char[73]>
                            (false,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x1b9,(char (*) [16])"Description of ",(char **)&local_140,
                             (char (*) [7])0x6a829c,&local_130,(char (*) [15])"\' is invalid: ",
                             (char (*) [37])"Shader stages of immutable sampler \'",Args_6_01,
                             (char (*) [35])"\' defined by the resource layout (",&msg_1,
                             (char (*) [70])
                             ") do not match the stages defined by the implicit resource signatre ("
                             ,&local_120,
                             (char (*) [73])
                             "). This might indicate a bug in the serialization/deserialization logic."
                            );
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_120._M_dataplus._M_p != &local_120.field_2) {
                    operator_delete(local_120._M_dataplus._M_p,
                                    local_120.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                break;
              }
              _Var28._M_cur = (__node_type *)((_Var28._M_cur)->super__Hash_node_base)._M_nxt;
            } while ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                      )_Var28._M_cur !=
                     _Var40.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                     ._M_cur);
          }
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
              )_Var28._M_cur ==
              _Var40.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
              ._M_cur) {
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (local_120._M_dataplus._M_p == (char *)0x0) {
              local_120._M_dataplus._M_p = "";
            }
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[45],char_const*,char[58],char[70]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1c1,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x6a829c,(char **)&local_120,(char (*) [15])"\' is invalid: ",
                       (char (*) [45])"Resource layout contains immutable sampler \'",Args_6_01,
                       (char (*) [58])"\' that is not present in the implicit resource signatre. ",
                       (char (*) [70])0x7590ac);
          }
          uVar35 = (*(ulong *)((long)&((_Var28._M_cur)->
                                      super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                      ._M_storage._M_storage + 8) & 0x7fffffffffffffff) %
                   AllImtblSamplers._M_h._M_bucket_count;
          p_Var47 = (__node_type *)AllImtblSamplers._M_h._M_buckets[uVar35];
          p_Var12 = p_Var47;
          do {
            p_Var32 = p_Var12;
            p_Var12 = (__node_type *)(p_Var32->super__Hash_node_base)._M_nxt;
          } while (p_Var12 != _Var28._M_cur);
          p_Var33 = ((_Var28._M_cur)->super__Hash_node_base)._M_nxt;
          if (p_Var47 == p_Var32) {
            if (p_Var33 != (_Hash_node_base *)0x0) {
              uVar39 = ((ulong)p_Var33[2]._M_nxt & 0x7fffffffffffffff) %
                       AllImtblSamplers._M_h._M_bucket_count;
              if (uVar39 == uVar35) goto LAB_004b153e;
              AllImtblSamplers._M_h._M_buckets[uVar39] = (__node_base_ptr)p_Var47;
              p_Var47 = (__node_type *)AllImtblSamplers._M_h._M_buckets[uVar35];
            }
            if ((__node_type *)&AllImtblSamplers._M_h._M_before_begin == p_Var47) {
              AllImtblSamplers._M_h._M_before_begin._M_nxt = p_Var33;
            }
            AllImtblSamplers._M_h._M_buckets[uVar35] = (__node_base_ptr)0x0;
          }
          else if ((p_Var33 != (_Hash_node_base *)0x0) &&
                  (uVar39 = ((ulong)p_Var33[2]._M_nxt & 0x7fffffffffffffff) %
                            AllImtblSamplers._M_h._M_bucket_count, uVar39 != uVar35)) {
            AllImtblSamplers._M_h._M_buckets[uVar39] = &p_Var32->super__Hash_node_base;
          }
LAB_004b153e:
          (p_Var32->super__Hash_node_base)._M_nxt = ((_Var28._M_cur)->super__Hash_node_base)._M_nxt;
          pcVar42 = (char *)AllImtblSamplers._M_h._M_buckets;
          std::__detail::
          _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
          ::_M_deallocate_node
                    ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
                      *)_Var28._M_cur,(__node_ptr)AllImtblSamplers._M_h._M_buckets);
          AllImtblSamplers._M_h._M_element_count = AllImtblSamplers._M_h._M_element_count - 1;
          local_14c = local_14c + 1;
        } while (local_14c < (CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers);
      }
      _Var8._M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
      if (AllImtblSamplers._M_h._M_element_count != 0) {
        p_Var33 = AllImtblSamplers._M_h._M_before_begin._M_nxt[5]._M_nxt;
        msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
        pcVar42 = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        local_120._M_dataplus._M_p = "";
        if (pcVar42 != (char *)0x0) {
          local_120._M_dataplus._M_p = pcVar42;
        }
        pcVar42 = "ValidatePipelineResourceSignatures";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[57],char_const*,char[47],char[70]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1ca,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6a829c,
                   (char **)&local_120,(char (*) [15])"\' is invalid: ",
                   (char (*) [57])"Implicit resource signature contains immutable sampler \'",
                   (char **)(p_Var33 + 1),
                   (char (*) [47])"\' that is not present in the resource layout. ",
                   (char (*) [70])0x7590ac);
        _Var8 = AllImtblSamplers._M_h._M_before_begin;
      }
    }
    while ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
            *)_Var8._M_nxt !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
            *)0x0) {
      p_Var13 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
                  **)_Var8._M_nxt;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
      ::_M_deallocate_node
                ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
                  *)_Var8._M_nxt,(__node_ptr)pcVar42);
      _Var8._M_nxt = (_Hash_node_base *)p_Var13;
    }
    __n_00 = (__node_ptr)0x0;
    memset(AllImtblSamplers._M_h._M_buckets,0,AllImtblSamplers._M_h._M_bucket_count << 3);
    AllImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllImtblSamplers._M_h._M_element_count = 0;
    _Var41._M_nxt = AllResources._M_h._M_before_begin._M_nxt;
    if (&AllImtblSamplers._M_h._M_single_bucket != AllImtblSamplers._M_h._M_buckets) {
      __n_00 = (__node_ptr)(AllImtblSamplers._M_h._M_bucket_count << 3);
      operator_delete(AllImtblSamplers._M_h._M_buckets,(ulong)__n_00);
      _Var41 = AllResources._M_h._M_before_begin;
    }
    while ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
            *)_Var41._M_nxt !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
            *)0x0) {
      p_Var14 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
                  **)_Var41._M_nxt;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
      ::_M_deallocate_node
                ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
                  *)_Var41._M_nxt,__n_00);
      _Var41._M_nxt = (_Hash_node_base *)p_Var14;
    }
    memset(AllResources._M_h._M_buckets,0,AllResources._M_h._M_bucket_count << 3);
    AllResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllResources._M_h._M_element_count = 0;
    if (&AllResources._M_h._M_single_bucket != AllResources._M_h._M_buckets) {
      operator_delete(AllResources._M_h._M_buckets,AllResources._M_h._M_bucket_count << 3);
    }
  }
  return;
}

Assistant:

void ValidatePipelineResourceSignatures(const PipelineStateCreateInfo& CreateInfo,
                                        const IRenderDevice*           pDevice) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    const RenderDeviceInfo& DeviceInfo = pDevice->GetDeviceInfo();
    const DeviceFeatures&   Features   = DeviceInfo.Features;

    const PipelineStateDesc& PSODesc = CreateInfo.PSODesc;

    const PSOCreateInternalInfo*    pInternalCI   = static_cast<const PSOCreateInternalInfo*>(CreateInfo.pInternalData);
    const PSO_CREATE_INTERNAL_FLAGS InternalFlags = pInternalCI != nullptr ? pInternalCI->Flags : PSO_CREATE_INTERNAL_FLAG_NONE;

    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0 && CreateInfo.ResourceSignaturesCount != 1)
        LOG_PSO_ERROR_AND_THROW("When PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0 flag is set, ResourceSignaturesCount (", CreateInfo.ResourceSignaturesCount, ") must be 1.");

    if (CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures == nullptr)
        LOG_PSO_ERROR_AND_THROW("ppResourceSignatures is null, but ResourceSignaturesCount (", CreateInfo.ResourceSignaturesCount, ") is not zero.");

    if (CreateInfo.ppResourceSignatures != nullptr && CreateInfo.ResourceSignaturesCount == 0)
        LOG_PSO_ERROR_AND_THROW("ppResourceSignatures is not null, but ResourceSignaturesCount is zero.");

    if (CreateInfo.ppResourceSignatures == nullptr)
        return;

    if (CreateInfo.PSODesc.SRBAllocationGranularity != 1)
    {
        LOG_WARNING_MESSAGE("PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning.");
    }

    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
    {
        if (CreateInfo.PSODesc.ResourceLayout.NumVariables != 0)
        {
            LOG_PSO_ERROR_AND_THROW("The number of variables defined through resource layout (", CreateInfo.PSODesc.ResourceLayout.NumVariables,
                                    ") must be zero when resource signatures are used.");
        }

        if (CreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers != 0)
        {
            LOG_PSO_ERROR_AND_THROW("The number of immutable samplers defined through resource layout (", CreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers,
                                    ") must be zero when resource signatures are used.");
        }
    }

    struct ResourceInfo
    {
        const SHADER_TYPE                 Stages;
        const IPipelineResourceSignature* pSign;
        const PipelineResourceDesc&       Desc;
    };
    struct ImtblSamInfo
    {
        const SHADER_TYPE                 Stages;
        const IPipelineResourceSignature* pSign;
        const ImmutableSamplerDesc&       Desc;
    };

    std::unordered_multimap<HashMapStringKey, ResourceInfo> AllResources;
    std::unordered_multimap<HashMapStringKey, ImtblSamInfo> AllImtblSamplers;

    std::array<const IPipelineResourceSignature*, MAX_RESOURCE_SIGNATURES> ppSignatures = {};
    for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
    {
        const IPipelineResourceSignature* const pSignature = CreateInfo.ppResourceSignatures[i];
        if (pSignature == nullptr)
            LOG_PSO_ERROR_AND_THROW("Pipeline resource signature at index ", i, " is null");

        const PipelineResourceSignatureDesc& SignDesc = pSignature->GetDesc();
        VERIFY(SignDesc.BindingIndex < MAX_RESOURCE_SIGNATURES,
               "Resource signature binding index exceeds the limit. This error should've been caught by ValidatePipelineResourceSignatureDesc.");

        if (ppSignatures[SignDesc.BindingIndex] != nullptr)
        {
            LOG_PSO_ERROR_AND_THROW("Pipeline resource signature '", pSignature->GetDesc().Name, "' at binding index ", Uint32{SignDesc.BindingIndex},
                                    " conflicts with another resource signature '", ppSignatures[SignDesc.BindingIndex]->GetDesc().Name,
                                    "' that uses the same index.");
        }
        ppSignatures[SignDesc.BindingIndex] = pSignature;

        for (Uint32 res = 0; res < SignDesc.NumResources; ++res)
        {
            const PipelineResourceDesc& ResDesc = SignDesc.Resources[res];
            VERIFY(ResDesc.Name != nullptr && ResDesc.Name[0] != '\0', "Resource name can't be null or empty. This should've been caught by ValidatePipelineResourceSignatureDesc()");
            VERIFY(ResDesc.ShaderStages != SHADER_TYPE_UNKNOWN, "Shader stages can't be UNKNOWN. This should've been caught by ValidatePipelineResourceSignatureDesc()");

            auto range = AllResources.equal_range(ResDesc.Name);
            for (auto it = range.first; it != range.second; ++it)
            {
                const ResourceInfo& OtherRes = it->second;
                if ((OtherRes.Stages & ResDesc.ShaderStages) != 0)
                {
                    VERIFY(OtherRes.pSign != pSignature, "Overlapping resources in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("Shader resource '", ResDesc.Name, "' is found in more than one resource signature ('", SignDesc.Name,
                                            "' and '", OtherRes.pSign->GetDesc().Name,
                                            "') in the same shader stage. Every shader resource in the PSO must be unambiguously defined by only one resource signature.");
                }

                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(OtherRes.Stages != SHADER_TYPE_UNKNOWN);
                    VERIFY(OtherRes.pSign != pSignature, "Resources with the same name in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but shader resource '", ResDesc.Name, "' is found in more than one resource signature ('",
                                            SignDesc.Name, "' and '", OtherRes.pSign->GetDesc().Name,
                                            "') in different stages. When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single resource for all stages.");
                }
            }
            AllResources.emplace(ResDesc.Name, ResourceInfo{ResDesc.ShaderStages, pSignature, ResDesc});
        }

        for (Uint32 res = 0; res < SignDesc.NumImmutableSamplers; ++res)
        {
            const ImmutableSamplerDesc& SamDesc = SignDesc.ImmutableSamplers[res];
            VERIFY(SamDesc.SamplerOrTextureName != nullptr && SamDesc.SamplerOrTextureName[0] != '\0', "Sampler name can't be null or empty. This should've been caught by ValidatePipelineResourceSignatureDesc()");
            VERIFY(SamDesc.ShaderStages != SHADER_TYPE_UNKNOWN, "Shader stage can't be UNKNOWN. This should've been caught by ValidatePipelineResourceSignatureDesc()");

            auto range = AllImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);
            for (auto it = range.first; it != range.second; ++it)
            {
                const ImtblSamInfo& OtherSam = it->second;
                if ((OtherSam.Stages & SamDesc.ShaderStages) != 0)
                {
                    VERIFY(OtherSam.pSign != pSignature, "Overlapping immutable samplers in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("Immutable sampler '", SamDesc.SamplerOrTextureName, "' is found in more than one resource signature ('", SignDesc.Name,
                                            "' and '", OtherSam.pSign->GetDesc().Name,
                                            "') in the same stage. Every immutable sampler in the PSO must be unambiguously defined by only one resource signature.");
                }

                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(OtherSam.Stages != SHADER_TYPE_UNKNOWN);
                    VERIFY(OtherSam.pSign != pSignature, "Immutable samplers with the same name in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but immutable sampler '", SamDesc.SamplerOrTextureName, "' is found in more than one resource signature ('",
                                            SignDesc.Name, "' and '", OtherSam.pSign->GetDesc().Name,
                                            "') in different stages. When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single immutable sampler for all stages.");
                }
            }
            AllImtblSamplers.emplace(SamDesc.SamplerOrTextureName, ImtblSamInfo{SamDesc.ShaderStages, pSignature, SamDesc});
        }
    }


    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0 &&
        // Deserialized default signatures are empty in OpenGL.
        !DeviceInfo.IsGLDevice())
    {
        const PipelineResourceLayoutDesc& ResLayout = CreateInfo.PSODesc.ResourceLayout;
        for (Uint32 i = 0; i < ResLayout.NumVariables; ++i)
        {
            const ShaderResourceVariableDesc& Var = ResLayout.Variables[i];
            if (Var.Name == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name is null");

            auto range = AllResources.equal_range(Var.Name);
            auto it    = range.first;
            for (; it != range.second; ++it)
            {
                const ResourceInfo& SignRes = it->second;
                if ((SignRes.Stages & Var.ShaderStages) == 0)
                    continue;

                if (SignRes.Stages != Var.ShaderStages)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader stages of variable '", Var.Name, "' defined by the resource layout (", GetShaderStagesString(Var.ShaderStages),
                                            ") do not match the stages defined by the implicit resource signature (", GetShaderStagesString(SignRes.Stages),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                if (SignRes.Desc.VarType != Var.Type)
                {
                    LOG_PSO_ERROR_AND_THROW("The type of variable '", Var.Name, "' defined by the resource layout (", GetShaderVariableTypeLiteralName(Var.Type),
                                            ") does not match the type defined by the implicit resource signature (", GetShaderVariableTypeLiteralName(SignRes.Desc.VarType),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                break;
            }

            if (it == range.second)
            {
                // It is OK - there may be variables in the resource layout
                // that don't present in any shader.
            }
            else
            {
                AllResources.erase(it);
            }
        }
        for (const auto& it : AllResources)
        {
            const PipelineResourceDesc& ResDesc = it.second.Desc;

            bool VarTypeOK = ResDesc.VarType == ResLayout.DefaultVariableType;
            if (!VarTypeOK && ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
            {
                const PipelineResourceSignatureDesc& SignDesc = it.second.pSign->GetDesc();
                if (SignDesc.UseCombinedTextureSamplers)
                {
                    const ShaderResourceVariableDesc RefDesc = FindPipelineResourceLayoutVariable(PSODesc.ResourceLayout, ResDesc.Name, ResDesc.ShaderStages, SignDesc.CombinedSamplerSuffix);
                    // The type of the immutable sampler must match the type of the texture variable it is assigned to
                    VarTypeOK = RefDesc.Type == ResDesc.VarType;
                }
            }
            if (!VarTypeOK)
            {
                LOG_PSO_ERROR_AND_THROW("The type of variable '", ResDesc.Name, "' not explicitly defined by the resource layout (", GetShaderVariableTypeLiteralName(ResDesc.VarType),
                                        ") does not match the default variable type (", GetShaderVariableTypeLiteralName(ResLayout.DefaultVariableType),
                                        "). This might indicate a bug in the serialization/deserialization logic.");
            }
        }

        for (Uint32 i = 0; i < ResLayout.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& ImtblSam = ResLayout.ImmutableSamplers[i];
            if (ImtblSam.SamplerOrTextureName == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName is null");
            auto range = AllImtblSamplers.equal_range(ImtblSam.SamplerOrTextureName);
            auto it    = range.first;
            for (; it != range.second; ++it)
            {
                const ImtblSamInfo& SignSam = it->second;
                if ((SignSam.Stages & ImtblSam.ShaderStages) == 0)
                    continue;

                if (SignSam.Stages != ImtblSam.ShaderStages)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader stages of immutable sampler '", ImtblSam.SamplerOrTextureName, "' defined by the resource layout (", GetShaderStagesString(ImtblSam.ShaderStages),
                                            ") do not match the stages defined by the implicit resource signatre (", GetShaderStagesString(ImtblSam.ShaderStages),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                break;
            }
            if (it == range.second)
            {
                LOG_PSO_ERROR_AND_THROW("Resource layout contains immutable sampler '", ImtblSam.SamplerOrTextureName, "' that is not present in the implicit resource signatre. ",
                                        "This might indicate a bug in the serialization/deserialization logic.");
            }

            AllImtblSamplers.erase(it);
        }
        if (!AllImtblSamplers.empty())
        {
            const ImmutableSamplerDesc& SamDesc = AllImtblSamplers.begin()->second.Desc;
            LOG_PSO_ERROR_AND_THROW("Implicit resource signature contains immutable sampler '", SamDesc.SamplerOrTextureName, "' that is not present in the resource layout. ",
                                    "This might indicate a bug in the serialization/deserialization logic.");
        }
    }
}